

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang,string *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  pointer pcVar4;
  bool forResponseFile;
  long *plVar5;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string arg;
  string responseFlag;
  string responseFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string includeFlags;
  string name;
  string responseVar;
  string local_158;
  pointer local_138;
  undefined8 local_130;
  undefined8 local_128;
  char *local_120;
  undefined8 local_118;
  string *local_110;
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  string local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_158._M_dataplus._M_p = &DAT_00000006;
  local_158._M_string_length = 0x7d5d93;
  local_158.field_2._M_allocated_capacity = 0;
  local_138 = (lang->_M_dataplus)._M_p;
  local_158.field_2._8_8_ = lang->_M_string_length;
  local_130 = 0;
  local_128 = 0x1f;
  local_120 = "_USE_RESPONSE_FILE_FOR_INCLUDES";
  local_118 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_158;
  local_110 = flags;
  cmCatViews(&local_50,views);
  forResponseFile = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&local_50);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = this->LocalGenerator;
  GetConfigName_abi_cxx11_(&local_158,this);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar3,&local_a8,pcVar2,lang,&local_158);
  paVar1 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = this->LocalGenerator;
  GetConfigName_abi_cxx11_(&local_158,this);
  cmLocalGenerator::GetIncludeFlags
            (&local_90,(cmLocalGenerator *)pcVar3,&local_a8,pcVar2,lang,&local_158,forResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (local_90._M_string_length == 0) goto LAB_00538f83;
  if (!forResponseFile) {
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[7])(this->LocalGenerator,local_110,&local_90);
    goto LAB_00538f83;
  }
  std::operator+(&local_158,"CMAKE_",lang);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c8.field_2._M_allocated_capacity = *psVar8;
    local_c8.field_2._8_8_ = plVar5[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar8;
    local_c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  psVar6 = cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_c8);
  pcVar4 = (psVar6->_M_dataplus)._M_p;
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar4,pcVar4 + psVar6->_M_string_length);
  if (local_100 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x822047);
  }
  local_158._M_dataplus._M_p = &DAT_00000009;
  local_158._M_string_length = 0x8241a2;
  local_158.field_2._M_allocated_capacity = 0;
  local_138 = (lang->_M_dataplus)._M_p;
  local_158.field_2._8_8_ = lang->_M_string_length;
  local_130 = 0;
  local_128 = 4;
  local_120 = ".rsp";
  local_118 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_158;
  cmCatViews(&local_70,views_00);
  makefile_depends =
       &std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
        ::operator[](&this->FlagFileDepends,lang)->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  CreateResponseFile(&local_e8,this,&local_70,&local_90,makefile_depends,lang);
  uVar9 = 0xf;
  if (local_108 != local_f8) {
    uVar9 = local_f8[0];
  }
  if (uVar9 < local_e8._M_string_length + local_100) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      uVar10 = local_e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_e8._M_string_length + local_100) goto LAB_00538e82;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_00538e82:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8._M_dataplus._M_p);
  }
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_158.field_2._M_allocated_capacity = *psVar8;
    local_158.field_2._8_8_ = puVar7[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar8;
    local_158._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_158._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)psVar8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[7])(this->LocalGenerator,local_110,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_00538f83:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang,
                                                const std::string& /*config*/)
{
  std::string const responseVar =
    cmStrCat("CMAKE_", lang, "_USE_RESPONSE_FILE_FOR_INCLUDES");
  bool const useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());

  std::string const includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, this->GetConfigName(),
    useResponseFile);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    std::string responseFlag =
      this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
    std::string const name = cmStrCat("includes_", lang, ".rsp");
    std::string const arg = std::move(responseFlag) +
      this->CreateResponseFile(name, includeFlags, this->FlagFileDepends[lang],
                               lang);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}